

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxStringCast::Emit(FxStringCast *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  uint uVar2;
  ExpEmit EVar3;
  int opc;
  ExpEmit EVar4;
  ExpEmit from;
  uint extraout_var;
  
  EVar3._0_4_ = (*this->basex->_vptr_FxExpression[9])();
  EVar3.Konst = (bool)(char)extraout_var;
  EVar3.Fixed = (bool)(char)(extraout_var >> 8);
  EVar3.Final = (bool)(char)(extraout_var >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var >> 0x18);
  from = EVar3;
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x4a3,"virtual ExpEmit FxStringCast::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::Free(&from,build);
  uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
  pPVar1 = this->basex->ValueType;
  if (pPVar1 == (PType *)TypeName) {
    opc = 0xb;
  }
  else {
    if (pPVar1 != (PType *)TypeSound) goto LAB_00508624;
    opc = 0xf;
  }
  VMFunctionBuilder::Emit(build,0x3e,uVar2 & 0xffff,EVar3._0_4_ & 0xffff,opc);
LAB_00508624:
  EVar4._0_4_ = uVar2 & 0xffff | 0x1020000;
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxStringCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);

	from.Free(build);
	ExpEmit to(build, REGT_STRING);
	if (basex->ValueType == TypeName)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_N2S);
	}
	else if (basex->ValueType == TypeSound)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_So2S);
	}
	return to;
}